

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O0

uint32_t * createDFDDepthStencil(int depthBits,int stencilBits,int sizeBytes)

{
  uint32_t *puVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  uint32_t *unaff_retaddr;
  int in_stack_00000010;
  uint32_t *DFD;
  channels_infotype in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar2;
  undefined8 in_stack_fffffffffffffff8;
  int sampleNo;
  
  puVar1 = writeHeader(0,0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  iVar2 = (int)in_stack_fffffffffffffff8;
  sampleNo = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if ((in_EDI == 0x18) && (in_ESI == 8)) {
    writeSample(unaff_retaddr,sampleNo,iVar2,0x18,8,in_EDX,in_stack_00000010,(VkSuffix)DFD);
    writeSample(unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                (int)in_stack_fffffffffffffff8,in_EDI,in_ESI,in_EDX,in_stack_00000010,(VkSuffix)DFD)
    ;
  }
  else {
    if (in_EDI == 0x20) {
      writeSample(unaff_retaddr,sampleNo,iVar2,0x20,in_ESI,in_EDX,in_stack_00000010,(VkSuffix)DFD);
    }
    else if (0 < in_EDI) {
      writeSample(unaff_retaddr,sampleNo,iVar2,in_EDI,in_ESI,in_EDX,in_stack_00000010,(VkSuffix)DFD)
      ;
    }
    if (0 < in_ESI) {
      iVar2 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
      if (in_EDI < 1) {
        writeSample(unaff_retaddr,iVar2,(int)in_stack_fffffffffffffff8,in_EDI,in_ESI,in_EDX,
                    in_stack_00000010,(VkSuffix)DFD);
      }
      else {
        writeSample(unaff_retaddr,iVar2,(int)in_stack_fffffffffffffff8,in_EDI,in_ESI,in_EDX,
                    in_stack_00000010,(VkSuffix)DFD);
      }
    }
  }
  return puVar1;
}

Assistant:

uint32_t *createDFDDepthStencil(int depthBits,
                                int stencilBits,
                                int sizeBytes)
{
    /* N.B. Little-endian is assumed. */
    uint32_t *DFD = 0;
    DFD = writeHeader((depthBits > 0) + (stencilBits > 0),
                      sizeBytes, s_UNORM, i_NON_COLOR);

    /* Handle the special case of D24_UNORM_S8_UINT where the order of the
       channels is flipped by putting stencil in the LSBs. */
    if (depthBits == 24 && stencilBits == 8) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                    8, 0,
                    1, 1, s_UINT);
        writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    24, 8,
                    1, 1, s_UNORM);
        return DFD;
    }

    if (depthBits == 32) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    32, 0,
                    1, 1, s_SFLOAT);
    } else if (depthBits > 0) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    depthBits, 0,
                    1, 1, s_UNORM);
    }
    if (stencilBits > 0) {
        if (depthBits > 0) {
            writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, depthBits,
                        1, 1, s_UINT);
        } else {
            writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, 0,
                        1, 1, s_UINT);
        }
    }
    return DFD;
}